

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O2

void T_UConverter_toUnicode_UTF32_LE_OFFSET_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  byte *pbVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  UChar *pUVar11;
  UChar UVar12;
  uint uVar13;
  long lVar14;
  
  pUVar2 = args->converter;
  pbVar5 = (byte *)args->source;
  pUVar11 = args->target;
  piVar8 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  uVar9 = (ulong)pUVar2->toULength;
  if (pUVar4 <= pUVar11 || (long)uVar9 < 1) {
    iVar10 = 0;
    goto LAB_00168b62;
  }
  pUVar2->toULength = '\0';
  uVar13 = pUVar2->toUnicodeStatus - 1;
  pUVar2->toUnicodeStatus = 0;
  iVar10 = 0;
  do {
    iVar6 = (int)uVar9 * 8;
    for (; uVar9 < 4; uVar9 = uVar9 + 1) {
      if (pbVar3 <= pbVar5) {
        pUVar2 = args->converter;
        pUVar2->toUnicodeStatus = uVar13 + 1;
        pUVar2->toULength = (int8_t)uVar9;
        goto LAB_00168bfa;
      }
      bVar1 = *pbVar5;
      pUVar2->toUBytes[uVar9] = bVar1;
      uVar13 = uVar13 | (uint)bVar1 << ((byte)iVar6 & 0x1f);
      pbVar5 = pbVar5 + 1;
      iVar6 = iVar6 + 8;
    }
    if ((0x10ffff < uVar13) || ((uVar13 & 0x1ff800) == 0xd800)) {
      args->converter->toULength = (int8_t)uVar9;
      *err = U_ILLEGAL_CHAR_FOUND;
      break;
    }
    if (uVar13 < 0x10000) {
      *pUVar11 = (UChar)uVar13;
      pUVar11 = pUVar11 + 1;
      lVar14 = 4;
      piVar7 = piVar8;
    }
    else {
      *pUVar11 = (short)(uVar13 >> 10) + L'ퟀ';
      piVar7 = piVar8 + 1;
      *piVar8 = iVar10;
      UVar12 = (UChar)uVar13 & 0x3ffU | 0xdc00;
      if (pUVar4 <= pUVar11 + 1) {
        pUVar2 = args->converter;
        pUVar2->UCharErrorBuffer[0] = UVar12;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        piVar8 = piVar7;
        pUVar11 = pUVar11 + 1;
        break;
      }
      pUVar11[1] = UVar12;
      pUVar11 = pUVar11 + 2;
      lVar14 = 8;
    }
    piVar8 = (int *)((long)piVar8 + lVar14);
    *piVar7 = iVar10;
    iVar10 = iVar10 + (int)uVar9;
LAB_00168b62:
    if (pbVar3 <= pbVar5) break;
    uVar13 = 0;
    uVar9 = 0;
  } while (pUVar11 < pUVar4);
LAB_00168bfa:
  if (((pbVar5 < pbVar3) && (pUVar4 <= pUVar11)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    *err = U_BUFFER_OVERFLOW_ERROR;
  }
  args->target = pUVar11;
  args->source = (char *)pbVar5;
  args->offsets = piVar8;
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_toUnicode_UTF32_LE_OFFSET_LOGIC(UConverterToUnicodeArgs * args,
                                             UErrorCode * err)
{
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = args->converter->toUBytes;
    uint32_t ch, i;
    int32_t offsetNum = 0;

    /* Restore state of current sequence */
    if (args->converter->toULength > 0 && myTarget < targetLimit)
    {
        i = args->converter->toULength;       /* restore # of bytes consumed */
        args->converter->toULength = 0;

        /* Stores the previously calculated ch from a previous call*/
        ch = args->converter->toUnicodeStatus - 1;
        args->converter->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        i = 0;
        ch = 0;
morebytes:
        while (i < sizeof(uint32_t))
        {
            if (mySource < sourceLimit)
            {
                ch |= ((uint8_t)(*mySource)) << (i * 8);
                toUBytes[i++] = (char) *(mySource++);
            }
            else
            {
                /* stores a partially calculated target*/
                /* + 1 to make 0 a valid character */
                args->converter->toUnicodeStatus = ch + 1;
                args->converter->toULength = (int8_t) i;
                goto donefornow;
            }
        }

        if (ch <= MAXIMUM_UTF && !U_IS_SURROGATE(ch))
        {
            /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
            if (ch <= MAXIMUM_UCS2) 
            {
                /* fits in 16 bits */
                *(myTarget++) = (UChar) ch;
                *(myOffsets++) = offsetNum;
            }
            else {
                /* write out the surrogates */
                *(myTarget++) = U16_LEAD(ch);
                *(myOffsets++) = offsetNum;
                ch = U16_TRAIL(ch);
                if (myTarget < targetLimit)
                {
                    *(myTarget++) = (UChar)ch;
                    *(myOffsets++) = offsetNum;
                }
                else
                {
                    /* Put in overflow buffer (not handled here) */
                    args->converter->UCharErrorBuffer[0] = (UChar) ch;
                    args->converter->UCharErrorBufferLength = 1;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
        }
        else
        {
            args->converter->toULength = (int8_t)i;
            *err = U_ILLEGAL_CHAR_FOUND;
            break;
        }
        offsetNum += i;
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}